

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream_keepalive_module.c
# Opt level: O0

void ngx_http_upstream_free_keepalive_peer(ngx_peer_connection_t *pc,void *data,ngx_uint_t state)

{
  ngx_connection_t *pnVar1;
  ngx_int_t nVar2;
  ngx_http_upstream_t *u;
  ngx_connection_t *c;
  ngx_queue_t *q;
  ngx_http_upstream_keepalive_cache_t *item;
  ngx_http_upstream_keepalive_peer_data_t *kp;
  ngx_uint_t state_local;
  void *data_local;
  ngx_peer_connection_t *pc_local;
  
  if ((pc->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pc->log,0,"free keepalive peer");
  }
  pnVar1 = pc->connection;
  if ((((((state & 4) == 0) && (pnVar1 != (ngx_connection_t *)0x0)) &&
       ((*(uint *)&pnVar1->read->field_0x8 >> 8 & 1) == 0)) &&
      (((((*(uint *)&pnVar1->read->field_0x8 >> 9 & 1) == 0 &&
         ((*(uint *)&pnVar1->read->field_0x8 >> 10 & 1) == 0)) &&
        (((*(uint *)&pnVar1->write->field_0x8 >> 9 & 1) == 0 &&
         (((*(uint *)&pnVar1->write->field_0x8 >> 10 & 1) == 0 &&
          ((*(ushort *)(*(long *)((long)data + 8) + 1000) >> 8 & 1) != 0)))))) &&
       ((*(ushort *)(*(long *)((long)data + 8) + 1000) >> 0xb & 1) != 0)))) &&
     (((ngx_terminate == 0 && (ngx_exiting == 0)) &&
      (nVar2 = ngx_handle_read_event(pnVar1->read,0), nVar2 == 0)))) {
    if ((pc->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pc->log,0,"free keepalive peer: saving connection %p",pnVar1);
    }
    if (*data + 0x18 == *(long *)(*data + 0x18)) {
      c = *(ngx_connection_t **)(*data + 8);
      c->read->data = c->data;
      *(ngx_event_t **)((long)c->data + 8) = c->read;
      c->data = (void *)0x0;
      c->read = (ngx_event_t *)0x0;
      ngx_http_upstream_keepalive_close((ngx_connection_t *)c->write);
    }
    else {
      c = *(ngx_connection_t **)(*data + 0x20);
      c->read->data = c->data;
      *(ngx_event_t **)((long)c->data + 8) = c->read;
      c->data = (void *)0x0;
      c->read = (ngx_event_t *)0x0;
    }
    q = (ngx_queue_t *)&c[-1].field_0xd8;
    c->read = *(ngx_event_t **)(*data + 0x10);
    c->read->data = c;
    c->data = (void *)(*data + 8);
    *(ngx_connection_t **)(*data + 0x10) = c;
    c->write = (ngx_event_t *)pnVar1;
    pc->connection = (ngx_connection_t *)0x0;
    if ((*(uint *)&pnVar1->read->field_0x8 >> 0xb & 1) != 0) {
      ngx_event_del_timer(pnVar1->read);
    }
    if ((*(uint *)&pnVar1->write->field_0x8 >> 0xb & 1) != 0) {
      ngx_event_del_timer(pnVar1->write);
    }
    pnVar1->write->handler = ngx_http_upstream_keepalive_dummy_handler;
    pnVar1->read->handler = ngx_http_upstream_keepalive_close_handler;
    pnVar1->data = q;
    *(uint *)&pnVar1->field_0xd8 = *(uint *)&pnVar1->field_0xd8 & 0xffffbfff | 0x4000;
    pnVar1->log = ngx_cycle->log;
    pnVar1->read->log = ngx_cycle->log;
    pnVar1->write->log = ngx_cycle->log;
    pnVar1->pool->log = ngx_cycle->log;
    c->fd = pc->socklen;
    memcpy(&c->field_0x1c,pc->sockaddr,(ulong)pc->socklen);
    if ((*(uint *)&pnVar1->read->field_0x8 >> 5 & 1) != 0) {
      ngx_http_upstream_keepalive_close_handler(pnVar1->read);
    }
  }
  (**(code **)((long)data + 0x20))(pc,*(undefined8 *)((long)data + 0x10),state);
  return;
}

Assistant:

static void
ngx_http_upstream_free_keepalive_peer(ngx_peer_connection_t *pc, void *data,
    ngx_uint_t state)
{
    ngx_http_upstream_keepalive_peer_data_t  *kp = data;
    ngx_http_upstream_keepalive_cache_t      *item;

    ngx_queue_t          *q;
    ngx_connection_t     *c;
    ngx_http_upstream_t  *u;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, pc->log, 0,
                   "free keepalive peer");

    /* cache valid connections */

    u = kp->upstream;
    c = pc->connection;

    if (state & NGX_PEER_FAILED
        || c == NULL
        || c->read->eof
        || c->read->error
        || c->read->timedout
        || c->write->error
        || c->write->timedout)
    {
        goto invalid;
    }

    if (!u->keepalive) {
        goto invalid;
    }

    if (!u->request_body_sent) {
        goto invalid;
    }

    if (ngx_terminate || ngx_exiting) {
        goto invalid;
    }

    if (ngx_handle_read_event(c->read, 0) != NGX_OK) {
        goto invalid;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, pc->log, 0,
                   "free keepalive peer: saving connection %p", c);

    if (ngx_queue_empty(&kp->conf->free)) {

        q = ngx_queue_last(&kp->conf->cache);
        ngx_queue_remove(q);

        item = ngx_queue_data(q, ngx_http_upstream_keepalive_cache_t, queue);

        ngx_http_upstream_keepalive_close(item->connection);

    } else {
        q = ngx_queue_head(&kp->conf->free);
        ngx_queue_remove(q);

        item = ngx_queue_data(q, ngx_http_upstream_keepalive_cache_t, queue);
    }

    ngx_queue_insert_head(&kp->conf->cache, q);

    item->connection = c;

    pc->connection = NULL;

    if (c->read->timer_set) {
        ngx_del_timer(c->read);
    }
    if (c->write->timer_set) {
        ngx_del_timer(c->write);
    }

    c->write->handler = ngx_http_upstream_keepalive_dummy_handler;
    c->read->handler = ngx_http_upstream_keepalive_close_handler;

    c->data = item;
    c->idle = 1;
    c->log = ngx_cycle->log;
    c->read->log = ngx_cycle->log;
    c->write->log = ngx_cycle->log;
    c->pool->log = ngx_cycle->log;

    item->socklen = pc->socklen;
    ngx_memcpy(&item->sockaddr, pc->sockaddr, pc->socklen);

    if (c->read->ready) {
        ngx_http_upstream_keepalive_close_handler(c->read);
    }

invalid:

    kp->original_free_peer(pc, kp->data, state);
}